

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icpu_helpers.cpp
# Opt level: O0

void n_e_s::core::PrintTo(CpuRegisters *r,ostream *os)

{
  ostream *poVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  args_3;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  uchar *in_stack_fffffffffffffc68;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2]>
  *__return_storage_ptr__;
  char (*local_370) [2];
  char (*local_360) [2];
  char (*local_350) [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_340;
  char (*local_330) [2];
  char (*local_320) [2];
  char (*local_310) [2];
  v8 *local_300;
  string local_2c8;
  char *local_298;
  undefined8 local_290;
  string local_288;
  ostream *local_268;
  ostream *os_local;
  CpuRegisters *r_local;
  undefined1 local_208 [16];
  v8 *local_1f8;
  char *local_1f0;
  uint8_t *local_1e8;
  uint8_t *local_1e0;
  uint8_t *local_1d8;
  uint8_t *local_1d0;
  CpuRegisters *local_1c8;
  char *local_1c0;
  undefined8 uStack_1b8;
  string *local_1b0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2]>
  local_1a8;
  undefined1 local_128 [16];
  v8 *local_118;
  char *local_110;
  char (*local_108) [2];
  char (*local_100) [2];
  char (*local_f8) [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_f0;
  char (*local_e8) [2];
  char (*local_e0) [2];
  char (*local_d8) [2];
  v8 *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  string *local_b8;
  char **local_b0;
  char *local_a8;
  char *pcStack_a0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_80;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
  *local_78;
  undefined8 local_70;
  undefined1 *local_68;
  char **local_60;
  char *local_58;
  char *pcStack_50;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2]>
  *local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2]>
  *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2],_char[2]>
  *local_20;
  
  local_298 = "PC: {:#06x} SP: {:#04x} A: {:#04x} x: {:#04x} Y: {:#04x}";
  local_290 = 0x38;
  local_1d0 = &r->sp;
  local_1d8 = &r->a;
  local_1e0 = &r->x;
  args_3.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&r->y;
  local_1c0 = "PC: {:#06x} SP: {:#04x} A: {:#04x} x: {:#04x} Y: {:#04x}";
  uStack_1b8 = 0x38;
  local_b0 = &local_1c0;
  local_1f8 = (v8 *)0x302004;
  local_1f0 = (char *)0x38;
  local_268 = os;
  os_local = (ostream *)r;
  local_1e8 = (uint8_t *)args_3;
  local_1c8 = r;
  local_1b0 = &local_288;
  local_a8 = (char *)local_1f8;
  pcStack_a0 = local_1f0;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_short_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&>
            ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
              *)&r_local,(v8 *)r,(unsigned_short *)local_1d0,local_1d8,local_1e0,
             (uchar *)args_3.values_,in_stack_fffffffffffffc68);
  local_88 = local_208;
  local_70 = 0x22222;
  args.field_1.values_ = args_3.values_;
  args.desc_ = (unsigned_long_long)&r_local;
  fmt.size_ = 0x22222;
  fmt.data_ = local_1f0;
  local_90 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
              *)&r_local;
  local_80 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
              *)&r_local;
  local_78 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char>
              *)&r_local;
  local_68 = local_88;
  ::fmt::v8::vformat_abi_cxx11_(&local_288,local_1f8,fmt,args);
  std::operator<<(os,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  poVar1 = local_268;
  if (((byte)os_local[6] & 0x80) == 0) {
    local_300 = (v8 *)0x3228f5;
  }
  else {
    local_300 = (v8 *)0x3235c8;
  }
  if (((byte)os_local[6] & 0x40) == 0) {
    local_310 = (char (*) [2])0x3228f5;
  }
  else {
    local_310 = (char (*) [2])0x31862c;
  }
  if (((byte)os_local[6] & 0x20) == 0) {
    local_320 = (char (*) [2])0x3228f5;
  }
  else {
    local_320 = (char (*) [2])0x31ccc1;
  }
  if (((byte)os_local[6] & 0x10) == 0) {
    local_330 = (char (*) [2])0x3228f5;
  }
  else {
    local_330 = (char (*) [2])0x31d08d;
  }
  if (((byte)os_local[6] & 8) == 0) {
    local_340.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x3228f5;
  }
  else {
    local_340.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x31b94f;
  }
  if (((byte)os_local[6] & 4) == 0) {
    local_350 = (char (*) [2])0x3228f5;
  }
  else {
    local_350 = (char (*) [2])0x3184e2;
  }
  if (((byte)os_local[6] & 2) == 0) {
    local_360 = (char (*) [2])0x3228f5;
  }
  else {
    local_360 = (char (*) [2])0x302052;
  }
  if (((byte)os_local[6] & 1) == 0) {
    local_370 = (char (*) [2])0x3228f5;
  }
  else {
    local_370 = (char (*) [2])0x31891f;
  }
  local_c8 = " P: {}{}{}{}{}{}{}{}";
  uStack_c0 = 0x14;
  local_d0 = local_300;
  local_d8 = local_310;
  local_e0 = local_320;
  local_e8 = local_330;
  local_f0.values_ = local_340.values_;
  local_f8 = local_350;
  local_100 = local_360;
  local_108 = local_370;
  local_60 = &local_c8;
  local_118 = (v8 *)0x30203d;
  local_110 = (char *)0x14;
  __return_storage_ptr__ = &local_1a8;
  local_b8 = &local_2c8;
  local_58 = (char *)local_118;
  pcStack_50 = local_110;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2]>
            (__return_storage_ptr__,local_300,local_310,local_320,local_330,
             (char (*) [2])local_340.values_,local_350,local_360,local_370,
             (char (*) [2])__return_storage_ptr__);
  local_40 = local_128;
  local_30 = 0xcccccccc;
  args_00.field_1.values_ = local_340.values_;
  args_00.desc_ = (unsigned_long_long)__return_storage_ptr__;
  fmt_00.size_ = 0xcccccccc;
  fmt_00.data_ = local_110;
  local_48 = __return_storage_ptr__;
  local_38 = __return_storage_ptr__;
  local_28 = local_40;
  local_20 = __return_storage_ptr__;
  ::fmt::v8::vformat_abi_cxx11_(&local_2c8,local_118,fmt_00,args_00);
  std::operator<<(poVar1,(string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::ostream::operator<<(local_268,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintTo(const CpuRegisters &r, std::ostream *os) {
    *os << fmt::format(
            "PC: {:#06x} SP: {:#04x} A: {:#04x} x: {:#04x} Y: {:#04x}",
            r.pc,
            r.sp,
            r.a,
            r.x,
            r.y);
    *os << fmt::format(" P: {}{}{}{}{}{}{}{}",
            r.p & N_FLAG ? "N" : "-",
            r.p & V_FLAG ? "V" : "-",
            r.p & FLAG_5 ? "5" : "-",
            r.p & B_FLAG ? "B" : "-",
            r.p & D_FLAG ? "D" : "-",
            r.p & I_FLAG ? "I" : "-",
            r.p & Z_FLAG ? "Z" : "-",
            r.p & C_FLAG ? "C" : "-");
    *os << std::endl;
}